

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::WriteKLToFile(KLVFilePacket *this,FileWriter *Writer,UL *label,ui32_t length)

{
  ui32_t uVar1;
  byte_t *__src;
  ulong uVar2;
  undefined4 in_register_0000000c;
  uint in_R8D;
  Result_t local_b8 [108];
  int local_4c;
  uint local_48;
  ui32_t write_count;
  byte_t buffer [20];
  ui32_t length_local;
  UL *label_local;
  FileWriter *Writer_local;
  KLVFilePacket *this_local;
  
  __src = Kumu::Identifier<16U>::Value((Identifier<16U> *)CONCAT44(in_register_0000000c,length));
  uVar1 = Kumu::Identifier<16U>::Size((Identifier<16U> *)CONCAT44(in_register_0000000c,length));
  memcpy(&local_48,__src,(ulong)uVar1);
  uVar2 = Kumu::write_BER(buffer + 8,(ulong)in_R8D,4);
  if ((uVar2 & 1) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    Kumu::FileWriter::Write((uchar *)local_b8,(uint)label,&local_48);
    Kumu::Result_t::~Result_t(local_b8);
    if (local_4c != 0x14) {
      __assert_fail("write_count == kl_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                    ,0x144,
                    "virtual ASDCP::Result_t ASDCP::KLVFilePacket::WriteKLToFile(Kumu::FileWriter &, const UL &, ui32_t)"
                   );
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::WriteKLToFile(Kumu::FileWriter& Writer, const UL& label, ui32_t length)
{
  byte_t buffer[kl_length];
  memcpy(buffer, label.Value(), label.Size());

  if ( ! Kumu::write_BER(buffer+SMPTE_UL_LENGTH, length, MXF_BER_LENGTH) )
    return RESULT_FAIL;

  ui32_t write_count;
  Writer.Write(buffer, kl_length, &write_count);
  assert(write_count == kl_length);
  return RESULT_OK;
}